

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assertiontests.cpp
# Opt level: O0

void anon_unknown.dwarf_2fa16::assert_not_in(void)

{
  initializer_list<int> __l;
  TestFailure *anon_var_0;
  allocator<int> local_41;
  int local_40 [4];
  iterator local_30;
  size_type local_28;
  undefined1 local_20 [8];
  vector<int,_std::allocator<int>_> v;
  
  local_40[0] = 0;
  local_40[1] = 1;
  local_40[2] = 2;
  local_40[3] = 3;
  local_30 = local_40;
  local_28 = 4;
  std::allocator<int>::allocator(&local_41);
  __l._M_len = local_28;
  __l._M_array = local_30;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_20,__l,&local_41);
  std::allocator<int>::~allocator(&local_41);
  UnitTests::Assert::Assert
            ((Assert *)&anon_var_0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/john-mullins[P]TestFramework/tests/assertiontests.cpp"
             ,0x12e);
  UnitTests::Assert::NotIn<int,std::vector<int,std::allocator<int>>&>
            ((Assert *)&anon_var_0,10,(vector<int,_std::allocator<int>_> *)local_20);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_20);
  return;
}

Assistant:

TEST(assert_not_in)
    {
        try
        {
            std::vector<int> v{0, 1, 2, 3};
            ASSERT_NOT_IN(10, v);
        }
        catch (UnitTests::TestFailure&)
        {
            FAIL("ASSERT_NOT_IN should not have fired here.");
        }
    }